

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathDebugDumpCompExpr(FILE *output,xmlXPathCompExprPtr comp,int depth)

{
  uint uVar1;
  ulong __n;
  char shift [100];
  char local_88 [104];
  
  if (comp == (xmlXPathCompExprPtr)0x0 || output == (FILE *)0x0) {
    return;
  }
  if (depth < 1) {
    __n = 0;
  }
  else {
    uVar1 = 0x18;
    if (depth - 1U < 0x18) {
      uVar1 = depth - 1U;
    }
    __n = (ulong)(uVar1 * 2 + 2);
    memset(local_88,0x20,__n);
  }
  (local_88 + __n)[0] = '\0';
  (local_88 + __n)[1] = '\0';
  fputs(local_88,(FILE *)output);
  if (comp->stream != (xmlPatternPtr)0x0) {
    fwrite("Streaming Expression\n",0x15,1,(FILE *)output);
    return;
  }
  fprintf((FILE *)output,"Compiled Expression : %d elements\n",(ulong)(uint)comp->nbStep);
  xmlXPathDebugDumpStepOp(output,comp,comp->steps + comp->last,depth + 1);
  return;
}

Assistant:

void
xmlXPathDebugDumpCompExpr(FILE *output, xmlXPathCompExprPtr comp,
	                  int depth) {
    int i;
    char shift[100];

    if ((output == NULL) || (comp == NULL)) return;

    for (i = 0;((i < depth) && (i < 25));i++)
        shift[2 * i] = shift[2 * i + 1] = ' ';
    shift[2 * i] = shift[2 * i + 1] = 0;

    fprintf(output, "%s", shift);

#ifdef XPATH_STREAMING
    if (comp->stream) {
        fprintf(output, "Streaming Expression\n");
    } else
#endif
    {
        fprintf(output, "Compiled Expression : %d elements\n",
                comp->nbStep);
        i = comp->last;
        xmlXPathDebugDumpStepOp(output, comp, &comp->steps[i], depth + 1);
    }
}